

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_verify.cpp
# Opt level: O3

bool Consensus::CheckTxInputs
               (CTransaction *tx,TxValidationState *state,CCoinsViewCache *inputs,int nSpendHeight,
               CAmount *txfee)

{
  long lVar1;
  bool bVar2;
  pointer pCVar3;
  Coin *pCVar4;
  CAmount n;
  ulong uVar5;
  _Alloc_hider _Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  ulong uVar7;
  ulong n_00;
  long in_FS_OFFSET;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)txfee;
  bVar2 = CCoinsViewCache::HaveInputs(inputs,tx);
  if (bVar2) {
    pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_finish == pCVar3) {
      n_00 = 0;
    }
    else {
      n_00 = 0;
      uVar5 = 0;
      uVar7 = 1;
      do {
        pCVar4 = CCoinsViewCache::AccessCoin(inputs,&pCVar3[uVar5].prevout);
        uVar5 = (pCVar4->out).nValue;
        if (uVar5 == 0xffffffffffffffff) {
          __assert_fail("!coin.IsSpent()",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/consensus/tx_verify.cpp"
                        ,0xb0,
                        "bool Consensus::CheckTxInputs(const CTransaction &, TxValidationState &, const CCoinsViewCache &, int, CAmount &)"
                       );
        }
        if (((*(uint *)&pCVar4->field_0x28 & 1) != 0) &&
           ((int)(nSpendHeight - (*(uint *)&pCVar4->field_0x28 >> 1)) < 100)) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"bad-txns-premature-spend-of-coinbase","");
          local_98._M_dataplus._M_p._0_4_ = nSpendHeight - (*(uint *)&pCVar4->field_0x28 >> 1);
          tinyformat::format<int>(&local_78,"tried to spend coinbase at depth %d",(int *)&local_98);
          bVar2 = ValidationState<TxValidationResult>::Invalid
                            (&state->super_ValidationState<TxValidationResult>,TX_PREMATURE_SPEND,
                             &local_58,&local_78);
          goto LAB_00461fbd;
        }
        if ((2100000000000000 < uVar5) || (n_00 = n_00 + uVar5, 2100000000000000 < n_00)) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"bad-txns-inputvalues-outofrange","");
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
          bVar2 = ValidationState<TxValidationResult>::Invalid
                            (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                             &local_58,&local_78);
          goto LAB_004621a2;
        }
        pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar3 >> 3) * 0x4ec4ec4ec4ec4ec5;
        bVar2 = uVar7 <= uVar5;
        lVar1 = uVar5 - uVar7;
        uVar5 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar2 && lVar1 != 0);
    }
    n = CTransaction::GetValueOut(tx);
    if ((long)n_00 < n) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"bad-txns-in-belowout","")
      ;
      FormatMoney_abi_cxx11_(&local_98,n_00);
      FormatMoney_abi_cxx11_(&local_b8,n);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                (&local_78,(tinyformat *)"value in (%s) < value out (%s)",(char *)&local_98,
                 &local_b8,args_1);
      bVar2 = ValidationState<TxValidationResult>::Invalid
                        (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,&local_58,
                         &local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      _Var6._M_p = (pointer)CONCAT44(local_98._M_dataplus._M_p._4_4_,(int)local_98._M_dataplus._M_p)
      ;
      local_78.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_98.field_2) goto LAB_004621b3;
    }
    else {
      if (n_00 - n < 0x775f05a074001) {
        *txfee = n_00 - n;
        bVar2 = true;
        goto LAB_004621d8;
      }
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"bad-txns-fee-outofrange","");
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
      bVar2 = ValidationState<TxValidationResult>::Invalid
                        (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,&local_58,
                         &local_78);
LAB_004621a2:
      _Var6._M_p = local_78._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) goto LAB_004621b3;
    }
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"bad-txns-inputs-missingorspent","");
    tinyformat::format<char[14]>
              (&local_78,"%s: inputs missing/spent",(char (*) [14])"CheckTxInputs");
    bVar2 = ValidationState<TxValidationResult>::Invalid
                      (&state->super_ValidationState<TxValidationResult>,TX_MISSING_INPUTS,&local_58
                       ,&local_78);
LAB_00461fbd:
    _Var6._M_p = local_78._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_004621b3:
      operator_delete(_Var6._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
LAB_004621d8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool Consensus::CheckTxInputs(const CTransaction& tx, TxValidationState& state, const CCoinsViewCache& inputs, int nSpendHeight, CAmount& txfee)
{
    // are the actual inputs available?
    if (!inputs.HaveInputs(tx)) {
        return state.Invalid(TxValidationResult::TX_MISSING_INPUTS, "bad-txns-inputs-missingorspent",
                         strprintf("%s: inputs missing/spent", __func__));
    }

    CAmount nValueIn = 0;
    for (unsigned int i = 0; i < tx.vin.size(); ++i) {
        const COutPoint &prevout = tx.vin[i].prevout;
        const Coin& coin = inputs.AccessCoin(prevout);
        assert(!coin.IsSpent());

        // If prev is coinbase, check that it's matured
        if (coin.IsCoinBase() && nSpendHeight - coin.nHeight < COINBASE_MATURITY) {
            return state.Invalid(TxValidationResult::TX_PREMATURE_SPEND, "bad-txns-premature-spend-of-coinbase",
                strprintf("tried to spend coinbase at depth %d", nSpendHeight - coin.nHeight));
        }

        // Check for negative or overflow input values
        nValueIn += coin.out.nValue;
        if (!MoneyRange(coin.out.nValue) || !MoneyRange(nValueIn)) {
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-inputvalues-outofrange");
        }
    }

    const CAmount value_out = tx.GetValueOut();
    if (nValueIn < value_out) {
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-in-belowout",
            strprintf("value in (%s) < value out (%s)", FormatMoney(nValueIn), FormatMoney(value_out)));
    }

    // Tally transaction fees
    const CAmount txfee_aux = nValueIn - value_out;
    if (!MoneyRange(txfee_aux)) {
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-fee-outofrange");
    }

    txfee = txfee_aux;
    return true;
}